

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  pointer pUVar2;
  undefined8 uVar3;
  LogMessage *other;
  pointer pUVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x9e);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: fields_ != NULL: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  uVar8 = 0;
  if (0 < num) {
    uVar8 = (ulong)(uint)num;
  }
  lVar5 = (long)start << 4;
  uVar6 = uVar8;
  while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
    UnknownField::Delete
              ((UnknownField *)
               (&((this->fields_->
                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  )._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar5));
    lVar5 = lVar5 + 0x10;
  }
  uVar6 = (ulong)(start + num);
  lVar5 = uVar6 << 4;
  while( true ) {
    pvVar1 = this->fields_;
    pUVar2 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pUVar4 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pUVar4 - (long)pUVar2 >> 4) <= uVar6) break;
    uVar3 = *(undefined8 *)((long)(&pUVar2->field_0x0 + lVar5) + 8);
    *(undefined8 *)(&pUVar2[-(long)num].field_0x0 + lVar5) =
         *(undefined8 *)(&pUVar2->field_0x0 + lVar5);
    *(undefined8 *)((long)(&pUVar2[-(long)num].field_0x0 + lVar5) + 8) = uVar3;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
  }
  while( true ) {
    pUVar4 = pUVar4 + -1;
    iVar7 = (int)uVar8;
    uVar8 = (ulong)(iVar7 - 1);
    if (iVar7 == 0) break;
    (pvVar1->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_finish = pUVar4;
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  GOOGLE_DCHECK(fields_ != NULL);
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (*fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_->size(); ++i) {
    (*fields_)[i - num] = (*fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_->pop_back();
  }
}